

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

any __thiscall OpenMD::SelectionCompiler::valuePeek(SelectionCompiler *this)

{
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  _func_void__Op_any_ptr__Arg_ptr *p_Var2;
  _Storage extraout_RDX;
  _Storage extraout_RDX_00;
  _Storage _Var3;
  any *in_RSI;
  any *in_RDI;
  any aVar4;
  
  p_Var1 = in_RSI[0x13]._M_manager;
  p_Var2 = (_func_void__Op_any_ptr__Arg_ptr *)
           std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                     ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
                      &in_RSI[0x11]._M_storage);
  if (p_Var1 == p_Var2) {
    std::any::any((any *)0x3fa064);
    _Var3 = extraout_RDX;
  }
  else {
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)&in_RSI[0x11]._M_storage,
               (size_type)in_RSI[0x13]._M_manager);
    std::any::any(in_RSI,in_RDI);
    _Var3 = extraout_RDX_00;
  }
  aVar4._M_storage._M_ptr = _Var3._M_ptr;
  aVar4._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)in_RDI;
  return aVar4;
}

Assistant:

std::any SelectionCompiler::valuePeek() {
    if (itokenInfix == atokenInfix.size()) {
      return std::any();
    } else {
      return atokenInfix[itokenInfix].value;
    }
  }